

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.c
# Opt level: O0

void nn_fsm_init(nn_fsm *self,nn_fsm_fn fn,nn_fsm_fn shutdown_fn,int src,void *srcptr,nn_fsm *owner)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  long in_R9;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  *(undefined4 *)(in_RDI + 2) = 1;
  *(undefined4 *)((long)in_RDI + 0x14) = in_ECX;
  in_RDI[3] = in_R8;
  in_RDI[4] = in_R9;
  in_RDI[5] = *(undefined8 *)(in_R9 + 0x28);
  nn_fsm_event_init((nn_fsm_event *)0x1385a0);
  return;
}

Assistant:

void nn_fsm_init (struct nn_fsm *self, nn_fsm_fn fn,
    nn_fsm_fn shutdown_fn, int src, void *srcptr, struct nn_fsm *owner)
{
    self->fn = fn;
    self->shutdown_fn = shutdown_fn;
    self->state = NN_FSM_STATE_IDLE;
    self->src = src;
    self->srcptr = srcptr;
    self->owner = owner;
    self->ctx = owner->ctx;
    nn_fsm_event_init (&self->stopped);
}